

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_for_each.cpp
# Opt level: O0

void __thiscall ParallelForEach_OneElement_Test::TestBody(ParallelForEach_OneElement_Test *this)

{
  bool bVar1;
  char *message;
  vector<int,_std::allocator<int>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>
  *matcher;
  AssertHelper local_b8;
  Message local_b0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  container out;
  undefined1 local_40 [8];
  container expected;
  container src;
  ParallelForEach_OneElement_Test *this_local;
  
  anon_unknown.dwarf_87b07::ParallelForEach::make_input
            ((container *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,1);
  anon_unknown.dwarf_87b07::ParallelForEach::make_expected((container *)local_40,1);
  anon_unknown.dwarf_87b07::ParallelForEach::run_for_each
            ((container *)&gtest_ar.message_,
             (container *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  testing::ContainerEq<std::vector<int,std::allocator<int>>>(&local_a8,(testing *)local_40,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,std::allocator<int>>>>>
            (&local_90,(internal *)&local_a8,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,std::allocator<int>>>>>
  ::operator()(local_78,(char *)&local_90,(vector<int,_std::allocator<int>_> *)0x29b513);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_90);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>
  ::~PolymorphicMatcher(&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_parallel_for_each.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  return;
}

Assistant:

TEST_F (ParallelForEach, OneElement) {
    auto const src = make_input (1U);
    auto const expected = make_expected (1U);
    auto const out = run_for_each (src);
    EXPECT_THAT (out, ::testing::ContainerEq (expected));
}